

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigApi.c
# Opt level: O3

Fraig_Node_t * Fraig_ManReadIthVar(Fraig_Man_t *p,int i)

{
  Fraig_NodeVec_t *pFVar1;
  Fraig_Node_t *pFVar2;
  int iVar3;
  
  if (i < 0) {
    puts("Requesting a PI with a negative number");
    pFVar2 = (Fraig_Node_t *)0x0;
  }
  else {
    pFVar1 = p->vInputs;
    if (pFVar1->nSize <= i) {
      iVar3 = (i - pFVar1->nSize) + 1;
      do {
        Fraig_NodeCreatePi(p);
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
      pFVar1 = p->vInputs;
    }
    pFVar2 = pFVar1->pArray[(uint)i];
  }
  return pFVar2;
}

Assistant:

Fraig_Node_t * Fraig_ManReadIthVar( Fraig_Man_t * p, int i )
{
    int k;
    if ( i < 0 )
    {
        printf( "Requesting a PI with a negative number\n" );
        return NULL;
    }
    // create the PIs to fill in the interval
    if ( i >= p->vInputs->nSize )
        for ( k = p->vInputs->nSize; k <= i; k++ )
            Fraig_NodeCreatePi( p ); 
    return p->vInputs->pArray[i];
}